

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::setup_transposeLP(HModel *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  double dVar2;
  uint uVar4;
  int iVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer piVar9;
  pointer piVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer piVar14;
  pointer piVar15;
  pointer piVar16;
  pointer piVar17;
  pointer pdVar18;
  pointer pdVar19;
  pointer pdVar20;
  pointer pdVar21;
  pointer pdVar22;
  pointer pdVar23;
  pointer pdVar24;
  pointer pdVar25;
  pointer pdVar26;
  pointer pdVar27;
  pointer pdVar28;
  pointer pdVar29;
  int i;
  long lVar30;
  long lVar31;
  int i_1;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  double dVar36;
  allocator_type local_139;
  _Vector_base<double,_std::allocator<double>_> local_138;
  _Vector_base<double,_std::allocator<double>_> local_118;
  _Vector_base<double,_std::allocator<double>_> local_f8;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  vector<int,_std::allocator<int>_> iwork;
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  if ((this->intOption[1] != 0) &&
     (uVar1 = this->numCol, uVar3 = this->numRow, (double)(int)uVar1 / (double)(int)uVar3 <= 0.2)) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_b8,(long)(int)uVar1,
               (allocator_type *)&local_d8);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_d8,(long)this->numCol,
               (allocator_type *)&local_f8);
    pdVar6 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar34 = 0;
    uVar33 = (ulong)(uint)this->numCol;
    if (this->numCol < 1) {
      uVar33 = uVar34;
    }
    for (; uVar33 != uVar34; uVar34 = uVar34 + 1) {
      dVar36 = pdVar6[uVar34];
      dVar2 = pdVar7[uVar34];
      if ((((dVar36 != -1e+200) || (NAN(dVar36))) || (dVar2 != 1e+200)) || (NAN(dVar2))) {
        if (((dVar36 != 0.0) || (NAN(dVar36))) || ((dVar2 != 1e+200 || (NAN(dVar2))))) {
          if (((dVar36 != -1e+200) || (NAN(dVar36))) || ((dVar2 != 0.0 || (NAN(dVar2))))) {
            if ((((dVar36 != 0.0) || (NAN(dVar36))) || (dVar2 != 0.0)) || (NAN(dVar2)))
            goto LAB_001303fb;
            local_b8._M_impl.super__Vector_impl_data._M_start[uVar34] = -1e+200;
          }
          else {
            local_b8._M_impl.super__Vector_impl_data._M_start[uVar34] = pdVar8[uVar34];
          }
          dVar36 = 1e+200;
        }
        else {
          local_b8._M_impl.super__Vector_impl_data._M_start[uVar34] = -1e+200;
          dVar36 = pdVar8[uVar34];
        }
      }
      else {
        dVar36 = pdVar8[uVar34];
        local_b8._M_impl.super__Vector_impl_data._M_start[uVar34] = dVar36;
      }
      local_d8._M_impl.super__Vector_impl_data._M_start[uVar34] = dVar36;
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_f8,(long)this->numRow,
               (allocator_type *)&local_118);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_118,(long)this->numRow,
               (allocator_type *)&local_138);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_138,(long)this->numRow,
               (allocator_type *)&iwork);
    uVar4 = this->numRow;
    pdVar6 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar33 = 0;
    uVar34 = 0;
    if (0 < (int)uVar4) {
      uVar34 = (ulong)uVar4;
    }
    for (; uVar34 != uVar33; uVar33 = uVar33 + 1) {
      dVar36 = pdVar6[uVar33];
      dVar2 = pdVar7[uVar33];
      if ((dVar36 != dVar2) || (NAN(dVar36) || NAN(dVar2))) {
        if (((dVar36 != -1e+200) || (NAN(dVar36))) || ((dVar2 == 1e+200 && (!NAN(dVar2))))) {
          if (((dVar36 != -1e+200) || (NAN(dVar36))) && ((dVar2 == 1e+200 && (!NAN(dVar2))))) {
            local_f8._M_impl.super__Vector_impl_data._M_start[uVar33] = 0.0;
            goto LAB_0012fff4;
          }
          if ((((dVar36 != -1e+200) || (NAN(dVar36))) || (dVar2 != 1e+200)) || (NAN(dVar2)))
          goto LAB_001303dd;
          local_f8._M_impl.super__Vector_impl_data._M_start[uVar33] = 0.0;
          local_118._M_impl.super__Vector_impl_data._M_start[uVar33] = 0.0;
          dVar36 = 0.0;
        }
        else {
          local_f8._M_impl.super__Vector_impl_data._M_start[uVar33] = -1e+200;
          local_118._M_impl.super__Vector_impl_data._M_start[uVar33] = 0.0;
          dVar36 = -dVar2;
        }
      }
      else {
        local_f8._M_impl.super__Vector_impl_data._M_start[uVar33] = -1e+200;
LAB_0012fff4:
        local_118._M_impl.super__Vector_impl_data._M_start[uVar33] = 1e+200;
        dVar36 = -dVar36;
      }
      local_138._M_impl.super__Vector_impl_data._M_start[uVar33] = dVar36;
    }
    local_68._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_68._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&iwork,(long)(int)uVar4,(value_type *)&local_68,(allocator_type *)&local_88);
    local_88._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_88._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_68,(long)this->numRow + 1,
               (value_type *)&local_88,(allocator_type *)&local_48);
    uVar33 = (ulong)((long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    iVar35 = (int)uVar33;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_88,(long)iVar35,
               (allocator_type *)&local_48);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,(long)iVar35,&local_139);
    piVar9 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar34 = 0;
    uVar33 = uVar33 & 0xffffffff;
    if (iVar35 < 1) {
      uVar33 = uVar34;
    }
    for (; uVar33 != uVar34; uVar34 = uVar34 + 1) {
      iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [piVar9[uVar34]] =
           iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar9[uVar34]] + 1;
    }
    for (lVar30 = 1; uVar33 = (ulong)this->numRow, lVar30 <= (long)uVar33; lVar30 = lVar30 + 1) {
      local_68._M_impl.super__Vector_impl_data._M_start[lVar30] =
           iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar30 + -1] + local_68._M_impl.super__Vector_impl_data._M_start[lVar30 + -1];
    }
    for (lVar30 = 0; lVar30 < (int)uVar33; lVar30 = lVar30 + 1) {
      iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar30] = local_68._M_impl.super__Vector_impl_data._M_start[lVar30];
      uVar33 = (ulong)(uint)this->numRow;
    }
    piVar9 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar30 = 0;
    while (lVar31 = lVar30, lVar31 < this->numCol) {
      piVar10 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar32 = (long)piVar9[lVar31]; lVar30 = lVar31 + 1, lVar32 < piVar9[lVar31 + 1];
          lVar32 = lVar32 + 1) {
        iVar35 = piVar10[lVar32];
        iVar5 = iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar35];
        iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [iVar35] = iVar5 + 1;
        local_88._M_impl.super__Vector_impl_data._M_start[iVar5] = (int)lVar31;
        local_48._M_impl.super__Vector_impl_data._M_start[iVar5] = pdVar6[lVar32];
      }
    }
    iVar35 = this->numRow;
    this->numRow = this->numCol;
    this->numCol = iVar35;
    piVar14 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    piVar15 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_68._M_impl.super__Vector_impl_data._M_start;
    (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_68._M_impl.super__Vector_impl_data._M_finish;
    (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
    piVar10 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
    piVar16 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar17 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_88._M_impl.super__Vector_impl_data._M_start;
    (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_88._M_impl.super__Vector_impl_data._M_finish;
    pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar18 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar19 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
    pdVar7 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_f8._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar20 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar21 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_f8._M_impl.super__Vector_impl_data._M_start;
    (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = local_f8._M_impl.super__Vector_impl_data._M_finish;
    pdVar8 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_118._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar22 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar23 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_118._M_impl.super__Vector_impl_data._M_start;
    (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = local_118._M_impl.super__Vector_impl_data._M_finish;
    pdVar11 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar24 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar25 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_b8._M_impl.super__Vector_impl_data._M_start;
    (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = local_b8._M_impl.super__Vector_impl_data._M_finish;
    pdVar12 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_d8._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar26 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar27 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_d8._M_impl.super__Vector_impl_data._M_start;
    (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = local_d8._M_impl.super__Vector_impl_data._M_finish;
    pdVar13 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_138._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar28 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar29 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_138._M_impl.super__Vector_impl_data._M_start;
    (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = local_138._M_impl.super__Vector_impl_data._M_finish;
    local_138._M_impl.super__Vector_impl_data._M_start = pdVar28;
    local_138._M_impl.super__Vector_impl_data._M_finish = pdVar29;
    local_138._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar13;
    local_118._M_impl.super__Vector_impl_data._M_start = pdVar22;
    local_118._M_impl.super__Vector_impl_data._M_finish = pdVar23;
    local_118._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar8;
    local_f8._M_impl.super__Vector_impl_data._M_start = pdVar20;
    local_f8._M_impl.super__Vector_impl_data._M_finish = pdVar21;
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar7;
    local_d8._M_impl.super__Vector_impl_data._M_start = pdVar26;
    local_d8._M_impl.super__Vector_impl_data._M_finish = pdVar27;
    local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar12;
    local_b8._M_impl.super__Vector_impl_data._M_start = pdVar24;
    local_b8._M_impl.super__Vector_impl_data._M_finish = pdVar25;
    local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar11;
    local_88._M_impl.super__Vector_impl_data._M_start = piVar16;
    local_88._M_impl.super__Vector_impl_data._M_finish = piVar17;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = piVar10;
    local_68._M_impl.super__Vector_impl_data._M_start = piVar9;
    local_68._M_impl.super__Vector_impl_data._M_finish = piVar14;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = piVar15;
    local_48._M_impl.super__Vector_impl_data._M_start = pdVar18;
    local_48._M_impl.super__Vector_impl_data._M_finish = pdVar19;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar6;
    mlFg_Update(this,this->mlFg_action_TransposeLP);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&iwork.super__Vector_base<int,_std::allocator<int>_>);
LAB_001303dd:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_138);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_118);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f8);
LAB_001303fb:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  }
  return;
}

Assistant:

void HModel::setup_transposeLP() {
    if (intOption[INTOPT_TRANSPOSE_FLAG] == 0)
        return;

    int transposeCancelled = 0;
    if (1.0 * numCol / numRow > 0.2) {
//        cout << "transpose-cancelled-by-ratio" << endl;
        transposeCancelled = 1;
        return;
    }

    // Convert primal cost to dual bound
    const double inf = HSOL_CONST_INF;
    vector<double> dualRowLower(numCol);
    vector<double> dualRowUpper(numCol);
    for (int j = 0; j < numCol; j++) {
        double lower = colLower[j];
        double upper = colUpper[j];

        /*
         * Primal      Dual
         * Free        row = c
         * x > 0       row < c
         * x < 0       row > c
         * x = 0       row free
         * other       cancel
         */

        if (lower == -inf && upper == inf) {
            dualRowLower[j] = colCost[j];
            dualRowUpper[j] = colCost[j];
        } else if (lower == 0 && upper == inf) {
            dualRowLower[j] = -inf;
            dualRowUpper[j] = colCost[j];
        } else if (lower == -inf && upper == 0) {
            dualRowLower[j] = colCost[j];
            dualRowUpper[j] = +inf;
        } else if (lower == 0 && upper == 0) {
            dualRowLower[j] = -inf;
            dualRowUpper[j] = +inf;
        } else {
            transposeCancelled = 1;
            break;
        }
    }

    // Check flag
    if (transposeCancelled == 1) {
//        cout << "transpose-cancelled-by-column" << endl;
        return;
    }

    // Convert primal row bound to dual variable cost
    vector<double> dualColLower(numRow);
    vector<double> dualColUpper(numRow);
    vector<double> dualCost(numRow);
    for (int i = 0; i < numRow; i++) {
        double lower = rowLower[i];
        double upper = rowUpper[i];

        /*
         * Primal      Dual
         * row = b     Free
         * row < b     y < 0
         * row > b     y > 0
         * row free    y = 0
         * other       cancel
         */

        if (lower == upper) {
            dualColLower[i] = -inf;
            dualColUpper[i] = +inf;
            dualCost[i] = -lower;
        } else if (lower == -inf && upper != inf) {
            dualColLower[i] = -inf;
            dualColUpper[i] = 0;
            dualCost[i] = -upper;
        } else if (lower != -inf && upper == inf) {
            dualColLower[i] = 0;
            dualColUpper[i] = +inf;
            dualCost[i] = -lower;
        } else if (lower == -inf && upper == inf) {
            dualColLower[i] = 0;
            dualColUpper[i] = 0;
            dualCost[i] = 0;
        } else {
            transposeCancelled = 1;
            break;
        }
    }

    // Check flag
    if (transposeCancelled == 1) {
//        cout << "transpose-cancelled-by-row" << endl;
        return;
    }

    // We can now really transpose things
    vector<int> iwork(numRow, 0);
    vector<int> ARstart(numRow + 1, 0);
    int AcountX = Aindex.size();
    vector<int> ARindex(AcountX);
    vector<double> ARvalue(AcountX);
    for (int k = 0; k < AcountX; k++)
        iwork[Aindex[k]]++;
    for (int i = 1; i <= numRow; i++)
        ARstart[i] = ARstart[i - 1] + iwork[i - 1];
    for (int i = 0; i < numRow; i++)
        iwork[i] = ARstart[i];
    for (int iCol = 0; iCol < numCol; iCol++) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            int iRow = Aindex[k];
            int iPut = iwork[iRow]++;
            ARindex[iPut] = iCol;
            ARvalue[iPut] = Avalue[k];
        }
    }

    // Transpose the problem!
    swap(numRow, numCol);
    Astart.swap(ARstart);
    Aindex.swap(ARindex);
    Avalue.swap(ARvalue);
    colLower.swap(dualColLower);
    colUpper.swap(dualColUpper);
    rowLower.swap(dualRowLower);
    rowUpper.swap(dualRowUpper);
    colCost.swap(dualCost);
//    cout << "problem-transposed" << endl;
    //Deduce the consequences of transposing the LP
    mlFg_Update(mlFg_action_TransposeLP);
}